

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON__UINT32 __thiscall
ON_XMLNode::WriteToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool include_formatting,
          bool force_long_format,bool sorted_props)

{
  ON__UINT32 OVar1;
  
  OVar1 = (*this->_vptr_ON_XMLNode[0x1c])();
  return OVar1;
}

Assistant:

ON__UINT32 ON_XMLNode::WriteToStream(wchar_t* stream, ON__UINT32 max_chars, bool include_formatting,
                       bool force_long_format, bool sorted_props) const
{
  const auto cc = WriteToStreamEx(stream, max_chars, include_formatting, force_long_format, sorted_props);

#ifdef _DEBUG
  if (_private->m_debug_auto_test_read && (nullptr != stream))
  {
    ON_XMLNode test(TagName());
    const auto read = test.ReadFromStream(stream, true, true);
    if (read != cc._logical)
    {
      ON_ERROR("CRITICAL: Could not read back what was written");
    }
  }
#endif

  return cc._logical;
}